

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoeffBasedProduct.h
# Opt level: O0

void __thiscall
Eigen::
CoeffBasedProduct<Eigen::Matrix<double,-1,1,0,4,1>,Eigen::Map<Eigen::Matrix<double,1,-1,1,1,4>,0,Eigen::Stride<0,0>>const,256>
::
CoeffBasedProduct<Eigen::Matrix<double,_1,1,0,4,1>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,4>,0,Eigen::Stride<0,0>>>
          (CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_4,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_256>
           *this,Matrix<double,__1,_1,_0,_4,_1> *lhs,
          Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> *rhs)

{
  Index IVar1;
  Index IVar2;
  Matrix<double,__1,_1,_0,_4,_1> *in_RDX;
  Matrix<double,__1,_1,_0,_4,_1> *in_RSI;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> *in_RDI;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> *in_stack_ffffffffffffffc8;
  
  MatrixBase<Eigen::CoeffBasedProduct<Eigen::Matrix<double,_-1,_1,_0,_4,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_256>_>
  ::MatrixBase((MatrixBase<Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_4,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_256>_>
                *)0x2ac6f2);
  Matrix<double,_-1,_1,_0,_4,_1>::Matrix(in_RSI,in_RDX);
  Map<Eigen::Matrix<double,_1,_-1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_RDI,in_stack_ffffffffffffffc8);
  Matrix<double,_-1,_-1,_0,_4,_4>::Matrix((Matrix<double,__1,__1,_0,_4,_4> *)0x2ac722);
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_4,_1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_4,_1>_> *)0x2ac72c);
  IVar2 = MapBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_0>::
          rows((MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)0x2ac73b);
  if (IVar1 != IVar2) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/products/CoeffBasedProduct.h"
                  ,0x9e,
                  "Eigen::CoeffBasedProduct<Eigen::Matrix<double, -1, 1, 0, 4, 1>, const Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 4>>, 256>::CoeffBasedProduct(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, 1, 0, 4, 1>, Rhs = const Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 4>>, NestingFlags = 256, Lhs = Eigen::Matrix<double, -1, 1, 0, 4, 1>, Rhs = Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 4>>]"
                 );
  }
  return;
}

Assistant:

inline CoeffBasedProduct(const Lhs& lhs, const Rhs& rhs)
      : m_lhs(lhs), m_rhs(rhs)
    {
      // we don't allow taking products of matrices of different real types, as that wouldn't be vectorizable.
      // We still allow to mix T and complex<T>.
      EIGEN_STATIC_ASSERT((internal::scalar_product_traits<typename Lhs::RealScalar, typename Rhs::RealScalar>::Defined),
        YOU_MIXED_DIFFERENT_NUMERIC_TYPES__YOU_NEED_TO_USE_THE_CAST_METHOD_OF_MATRIXBASE_TO_CAST_NUMERIC_TYPES_EXPLICITLY)
      eigen_assert(lhs.cols() == rhs.rows()
        && "invalid matrix product"
        && "if you wanted a coeff-wise or a dot product use the respective explicit functions");
    }